

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O3

void __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::IdleCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   *this,SoftwareQueueIndex QueueInd,bool ReleaseResources)

{
  pthread_mutex_t *ppVar1;
  int iVar2;
  Uint64 FenceValue;
  Uint64 UVar3;
  char (*in_RCX) [27];
  pthread_mutex_t *__mutex;
  string msg;
  string local_40;
  
  if (this->m_CmdQueueCount <= (ulong)QueueInd.m_Value) {
    FormatString<char[26],char[27]>
              (&local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x6aa5f8,in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"IdleCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xa1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  __mutex = (pthread_mutex_t *)(this->m_CommandQueues + QueueInd.m_Value);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    if (ReleaseResources) {
      LOCK();
      ppVar1 = __mutex + 1;
      UVar3 = ppVar1->__align;
      ppVar1->__align = ppVar1->__align + 1;
      UNLOCK();
    }
    else {
      UVar3 = 0;
    }
    FenceValue = (**(code **)(**(long **)((long)__mutex + 0x30) + 0x30))();
    pthread_mutex_unlock(__mutex);
    if (ReleaseResources) {
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardStaleResources
                ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                 ((long)__mutex + 0x38),UVar3,FenceValue);
      UVar3 = (**(code **)(**(long **)((long)__mutex + 0x30) + 0x28))();
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
                ((ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *)
                 ((long)__mutex + 0x38),UVar3);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void IdleCommandQueue(SoftwareQueueIndex QueueInd, bool ReleaseResources)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue = m_CommandQueues[QueueInd];

        Uint64 CmdBufferNumber = 0;
        Uint64 FenceValue      = 0;
        {
            std::lock_guard<std::mutex> Lock{Queue.Mtx};

            if (ReleaseResources)
            {
                // Increment the command buffer number before idling the queue.
                // This will make sure that any resource released while this function
                // is running will be associated with the next command buffer submission.
                CmdBufferNumber = Queue.NextCmdBufferNumber.fetch_add(1);
                // fetch_add returns the original value immediately preceding the addition.
            }

            FenceValue = Queue.CmdQueue->WaitForIdle();
        }

        if (ReleaseResources)
        {
            Queue.ReleaseQueue.DiscardStaleResources(CmdBufferNumber, FenceValue);
            Queue.ReleaseQueue.Purge(Queue.CmdQueue->GetCompletedFenceValue());
        }
    }